

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  int *piVar1;
  ImGuiContextHook *pIVar2;
  undefined8 uVar3;
  int iVar4;
  ImGuiContextHook *__dest;
  int iVar5;
  int iVar6;
  
  if (*(long *)(hook + 8) != 0) {
    iVar4 = (ctx->Hooks).Size;
    if (iVar4 == (ctx->Hooks).Capacity) {
      if (iVar4 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar4 / 2 + iVar4;
      }
      iVar6 = iVar4 + 1;
      if (iVar4 + 1 < iVar5) {
        iVar6 = iVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar6 * 0x18,GImAllocatorUserData)
      ;
      pIVar2 = (ctx->Hooks).Data;
      if (pIVar2 != (ImGuiContextHook *)0x0) {
        memcpy(__dest,pIVar2,(long)(ctx->Hooks).Size * 0x18);
        pIVar2 = (ctx->Hooks).Data;
        if ((pIVar2 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (ctx->Hooks).Data = __dest;
      (ctx->Hooks).Capacity = iVar6;
      iVar4 = (ctx->Hooks).Size;
    }
    else {
      __dest = (ctx->Hooks).Data;
    }
    *(undefined8 *)(__dest + (long)iVar4 * 0x18 + 0x10) = *(undefined8 *)(hook + 0x10);
    uVar3 = *(undefined8 *)(hook + 8);
    *(undefined8 *)(__dest + (long)iVar4 * 0x18) = *(undefined8 *)hook;
    *(undefined8 *)(__dest + (long)iVar4 * 0x18 + 8) = uVar3;
    (ctx->Hooks).Size = (ctx->Hooks).Size + 1;
    return;
  }
  __assert_fail("hook->Callback != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0xd35,"void ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
}

Assistant:

void ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL);
    g.Hooks.push_back(*hook);
}